

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildBool32x4_1Int4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  uint32 local_34;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0x24e) {
    newOpcode = Simd128_IntsToB4;
  }
  else {
    AssertCount = AssertCount + 1;
    local_38 = dstRegSlot;
    local_34 = offset;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1806,"(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToB4)",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    dstRegSlot = local_38;
    offset = local_34;
  }
  local_40 = src3RegSlot;
  local_3c = src4RegSlot;
  local_48 = src1RegSlot;
  local_44 = src2RegSlot;
  BuildSimd_1Ints(this,newOpcode,offset,TySimd128B4,&local_48,dstRegSlot,4);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildBool32x4_1Int4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG5)
{
    AssertMsg(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToB4, "Unexpected opcode for this format.");

    uint const LANES = 4;
    Js::RegSlot srcRegSlot[LANES];
    srcRegSlot[0] = src1RegSlot;
    srcRegSlot[1] = src2RegSlot;
    srcRegSlot[2] = src3RegSlot;
    srcRegSlot[3] = src4RegSlot;

    BuildSimd_1Ints(newOpcode, offset, TySimd128B4, srcRegSlot, dstRegSlot, LANES);
}